

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

UninterpretedOption *
google::protobuf::DynamicCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  bool bVar1;
  TypeId a;
  TypeId b;
  MessageLite *from_local;
  
  if (from != (MessageLite *)0x0) {
    a = TypeId::Get<google::protobuf::UninterpretedOption>();
    b = TypeId::Get(from);
    bVar1 = operator!=(a,b);
    if (!bVar1) {
      return (UninterpretedOption *)from;
    }
  }
  return (UninterpretedOption *)0x0;
}

Assistant:

const T* DynamicCastMessage(const MessageLite* from) {
  static_assert(std::is_base_of<MessageLite, T>::value, "");

  // We might avoid the call to T::GetClassData() altogether if T were to
  // expose the class data pointer.
  if (from == nullptr || TypeId::Get<T>() != TypeId::Get(*from)) {
    return nullptr;
  }

  return static_cast<const T*>(from);
}